

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O1

cmCMakePath * __thiscall
cmCMakePath::GetWideExtension(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  size_type sVar1;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var2;
  int iVar3;
  long lVar4;
  path *ppVar5;
  string_view source;
  string file;
  long *local_58;
  long local_50;
  long local_48 [2];
  path local_38;
  
  sVar1 = (this->Path)._M_pathname._M_string_length;
  if (sVar1 != 0) {
    _Var2._M_head_impl =
         (this->Path)._M_cmpts._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    if (((ulong)_Var2._M_head_impl & 3) == 0) {
      if ((this->Path)._M_pathname._M_dataplus._M_p[sVar1 - 1] != '/') {
        if (((ulong)_Var2._M_head_impl & 3) == 0) {
          lVar4 = std::filesystem::__cxx11::path::_List::end();
        }
        else {
          lVar4 = 0;
        }
        ppVar5 = (path *)(lVar4 + -0x30);
        if ((*(byte *)&(this->Path)._M_cmpts._M_impl._M_t.
                       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                       ._M_head_impl & 3) != 0) {
          ppVar5 = &this->Path;
        }
        this = (cmCMakePath *)ppVar5;
        if ((~*(uint *)&(ppVar5->_M_cmpts)._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl & 3) == 0) goto LAB_0042e3c4;
      }
    }
    else if (((uint)_Var2._M_head_impl & 3) == 3) {
LAB_0042e3c4:
      std::filesystem::__cxx11::path::path(&local_38,&this->Path);
      goto LAB_0042e411;
    }
  }
  std::filesystem::__cxx11::path::path(&local_38);
LAB_0042e411:
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,local_38._M_pathname._M_dataplus._M_p,
             local_38._M_pathname._M_dataplus._M_p + local_38._M_pathname._M_string_length);
  std::filesystem::__cxx11::path::~path(&local_38);
  if ((((local_50 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_58), iVar3 == 0))
      || (iVar3 = std::__cxx11::string::compare((char *)&local_58), iVar3 == 0)) ||
     (lVar4 = std::__cxx11::string::find((char)&local_58,0x2e), lVar4 == -1)) {
    (__return_storage_ptr__->Path)._M_pathname.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->Path)._M_pathname.field_2 + 8) = 0;
    (__return_storage_ptr__->Path)._M_pathname._M_dataplus._M_p = (pointer)0x0;
    (__return_storage_ptr__->Path)._M_pathname._M_string_length = 0;
    (__return_storage_ptr__->Path)._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (_Impl *)0x0;
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->Path);
  }
  else {
    source._M_str = (char *)((long)local_58 + lVar4);
    source._M_len = local_50 - lVar4;
    cmCMakePath(__return_storage_ptr__,source,generic_format);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::GetWideExtension() const
{
  auto file = this->Path.filename().string();
  if (file.empty() || file == "." || file == "..") {
    return cmCMakePath{};
  }

  auto pos = file.find('.', file[0] == '.' ? 1 : 0);
  if (pos != std::string::npos) {
    return cm::string_view(file.data() + pos, file.length() - pos);
  }

  return cmCMakePath{};
}